

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O0

void __thiscall notch::io::PlainTextNetworkWriter::save(PlainTextNetworkWriter *this,Net *net)

{
  size_type sVar1;
  ostream *poVar2;
  reference spec;
  size_type local_88;
  size_t i;
  size_t n;
  NetSpec netSpec;
  Net *net_local;
  PlainTextNetworkWriter *this_local;
  
  netSpec._72_8_ = net;
  NetSpec::NetSpec((NetSpec *)&n,net);
  sVar1 = core::std::vector<notch::io::LayerSpec,_std::allocator<notch::io::LayerSpec>_>::size
                    ((vector<notch::io::LayerSpec,_std::allocator<notch::io::LayerSpec>_> *)
                     &netSpec.outputDim);
  poVar2 = std::operator<<(this->out,"net: ");
  poVar2 = std::operator<<(poVar2,(string *)&n);
  std::operator<<(poVar2,"\n");
  std::operator<<(this->out,"format: 1.0\n");
  poVar2 = std::operator<<(this->out,"inputs: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,netSpec._24_8_);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(this->out,"outputs: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,netSpec.inputDim);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(this->out,"layers: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar1);
  std::operator<<(poVar2,"\n");
  std::operator<<(this->out,"%%\n");
  for (local_88 = 0; local_88 < sVar1; local_88 = local_88 + 1) {
    spec = core::std::vector<notch::io::LayerSpec,_std::allocator<notch::io::LayerSpec>_>::
           operator[]((vector<notch::io::LayerSpec,_std::allocator<notch::io::LayerSpec>_> *)
                      &netSpec.outputDim,local_88);
    save(this,spec);
    if (local_88 < sVar1 - 1) {
      std::operator<<(this->out,"%%\n");
    }
  }
  NetSpec::~NetSpec((NetSpec *)&n);
  return;
}

Assistant:

void save(const Net &net) {
        auto netSpec = NetSpec(net);
        size_t n = netSpec.layers.size();
        out << "net: " << netSpec.tag << "\n";
        out << "format: 1.0\n"; // format version
        out << "inputs: " << netSpec.inputDim << "\n";
        out << "outputs: " << netSpec.outputDim << "\n";
        out << "layers: " << n << "\n";
        out << "%%\n";
        for (size_t i = 0; i < n; ++i) {
            save(netSpec.layers[i]);
            if (i < (n - 1)) {
                out << "%%\n";
            }
        }
    }